

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raw_hash_set.h
# Opt level: O2

iterator __thiscall
absl::lts_20240722::container_internal::
raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<std::pair<google::protobuf::Message_const*,google::protobuf::FieldDescriptor_const*>>,absl::lts_20240722::hash_internal::Hash<std::pair<google::protobuf::Message_const*,google::protobuf::FieldDescriptor_const*>>,std::equal_to<std::pair<google::protobuf::Message_const*,google::protobuf::FieldDescriptor_const*>>,std::allocator<std::pair<google::protobuf::Message_const*,google::protobuf::FieldDescriptor_const*>>>
::find_non_soo<std::pair<google::protobuf::Message_const*,google::protobuf::FieldDescriptor_const*>>
          (raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<std::pair<google::protobuf::Message_const*,google::protobuf::FieldDescriptor_const*>>,absl::lts_20240722::hash_internal::Hash<std::pair<google::protobuf::Message_const*,google::protobuf::FieldDescriptor_const*>>,std::equal_to<std::pair<google::protobuf::Message_const*,google::protobuf::FieldDescriptor_const*>>,std::allocator<std::pair<google::protobuf::Message_const*,google::protobuf::FieldDescriptor_const*>>>
           *this,key_arg<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>
                 *key,size_t hash)

{
  ctrl_t *pcVar1;
  slot_type *psVar2;
  undefined1 auVar3 [16];
  bool bVar4;
  uint32_t uVar5;
  int iVar6;
  ctrl_t *pcVar7;
  slot_type *psVar8;
  size_t sVar9;
  ulong extraout_RDX;
  ulong uVar10;
  ulong extraout_RDX_00;
  ulong uVar11;
  ushort x;
  undefined4 uVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  __m128i match;
  undefined1 auVar15 [16];
  ctrl_t cVar16;
  ctrl_t cVar18;
  ctrl_t cVar19;
  ctrl_t cVar20;
  ctrl_t cVar21;
  ctrl_t cVar22;
  ctrl_t cVar23;
  ctrl_t cVar24;
  ctrl_t cVar25;
  ctrl_t cVar26;
  ctrl_t cVar27;
  ctrl_t cVar28;
  ctrl_t cVar29;
  ctrl_t cVar30;
  ctrl_t cVar31;
  ctrl_t cVar32;
  undefined1 auVar17 [16];
  iterator iVar33;
  probe_seq<16UL> seq;
  probe_seq<16UL> local_70;
  ctrl_t local_58;
  ctrl_t cStack_57;
  ctrl_t cStack_56;
  ctrl_t cStack_55;
  ctrl_t cStack_54;
  ctrl_t cStack_53;
  ctrl_t cStack_52;
  ctrl_t cStack_51;
  ctrl_t cStack_50;
  ctrl_t cStack_4f;
  ctrl_t cStack_4e;
  ctrl_t cStack_4d;
  ctrl_t cStack_4c;
  ctrl_t cStack_4b;
  ctrl_t cStack_4a;
  ctrl_t cStack_49;
  undefined1 local_48 [16];
  
  bVar4 = raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>,_absl::lts_20240722::hash_internal::Hash<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>,_std::equal_to<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>,_std::allocator<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>_>
          ::is_soo((raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>,_absl::lts_20240722::hash_internal::Hash<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>,_std::equal_to<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>,_std::allocator<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>_>
                    *)this);
  if (bVar4) {
    __assert_fail("!is_soo()",
                  "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O2/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                  ,0xdb0,
                  "iterator absl::container_internal::raw_hash_set<absl::container_internal::FlatHashSetPolicy<std::pair<const google::protobuf::Message *, const google::protobuf::FieldDescriptor *>>, absl::hash_internal::Hash<std::pair<const google::protobuf::Message *, const google::protobuf::FieldDescriptor *>>, std::equal_to<std::pair<const google::protobuf::Message *, const google::protobuf::FieldDescriptor *>>, std::allocator<std::pair<const google::protobuf::Message *, const google::protobuf::FieldDescriptor *>>>::find_non_soo(const key_arg<K> &, size_t) [Policy = absl::container_internal::FlatHashSetPolicy<std::pair<const google::protobuf::Message *, const google::protobuf::FieldDescriptor *>>, Hash = absl::hash_internal::Hash<std::pair<const google::protobuf::Message *, const google::protobuf::FieldDescriptor *>>, Eq = std::equal_to<std::pair<const google::protobuf::Message *, const google::protobuf::FieldDescriptor *>>, Alloc = std::allocator<std::pair<const google::protobuf::Message *, const google::protobuf::FieldDescriptor *>>, K = std::pair<const google::protobuf::Message *, const google::protobuf::FieldDescriptor *>]"
                 );
  }
  probe(&local_70,(CommonFields *)this,hash);
  pcVar7 = raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>,_absl::lts_20240722::hash_internal::Hash<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>,_std::equal_to<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>,_std::allocator<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>_>
           ::control((raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>,_absl::lts_20240722::hash_internal::Hash<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>,_std::equal_to<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>,_std::allocator<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>_>
                      *)this);
  auVar13 = ZEXT416((CONCAT11((char)hash,(char)hash) & 0xff7f) & 0xffff7fff);
  auVar13 = pshuflw(auVar13,auVar13,0);
  uVar12 = auVar13._0_4_;
  local_48._4_4_ = uVar12;
  local_48._0_4_ = uVar12;
  local_48._8_4_ = uVar12;
  local_48._12_4_ = uVar12;
  uVar10 = extraout_RDX;
  while( true ) {
    pcVar1 = pcVar7 + local_70.offset_;
    auVar13[0] = -(local_48[0] == *pcVar1);
    auVar13[1] = -(local_48[1] == pcVar1[1]);
    auVar13[2] = -(local_48[2] == pcVar1[2]);
    auVar13[3] = -(local_48[3] == pcVar1[3]);
    auVar13[4] = -(local_48[4] == pcVar1[4]);
    auVar13[5] = -(local_48[5] == pcVar1[5]);
    auVar13[6] = -(local_48[6] == pcVar1[6]);
    auVar13[7] = -(local_48[7] == pcVar1[7]);
    auVar13[8] = -(local_48[8] == pcVar1[8]);
    auVar13[9] = -(local_48[9] == pcVar1[9]);
    auVar13[10] = -(local_48[10] == pcVar1[10]);
    auVar13[0xb] = -(local_48[0xb] == pcVar1[0xb]);
    auVar13[0xc] = -(local_48[0xc] == pcVar1[0xc]);
    auVar13[0xd] = -(local_48[0xd] == pcVar1[0xd]);
    auVar13[0xe] = -(local_48[0xe] == pcVar1[0xe]);
    auVar13[0xf] = -(local_48[0xf] == pcVar1[0xf]);
    cVar16 = *pcVar1;
    cVar18 = pcVar1[1];
    cVar19 = pcVar1[2];
    cVar20 = pcVar1[3];
    cVar21 = pcVar1[4];
    cVar22 = pcVar1[5];
    cVar23 = pcVar1[6];
    cVar24 = pcVar1[7];
    cVar25 = pcVar1[8];
    cVar26 = pcVar1[9];
    cVar27 = pcVar1[10];
    cVar28 = pcVar1[0xb];
    cVar29 = pcVar1[0xc];
    cVar30 = pcVar1[0xd];
    cVar31 = pcVar1[0xe];
    cVar32 = pcVar1[0xf];
    for (x = (ushort)(SUB161(auVar13 >> 7,0) & 1) | (ushort)(SUB161(auVar13 >> 0xf,0) & 1) << 1 |
             (ushort)(SUB161(auVar13 >> 0x17,0) & 1) << 2 |
             (ushort)(SUB161(auVar13 >> 0x1f,0) & 1) << 3 |
             (ushort)(SUB161(auVar13 >> 0x27,0) & 1) << 4 |
             (ushort)(SUB161(auVar13 >> 0x2f,0) & 1) << 5 |
             (ushort)(SUB161(auVar13 >> 0x37,0) & 1) << 6 |
             (ushort)(SUB161(auVar13 >> 0x3f,0) & 1) << 7 |
             (ushort)(SUB161(auVar13 >> 0x47,0) & 1) << 8 |
             (ushort)(SUB161(auVar13 >> 0x4f,0) & 1) << 9 |
             (ushort)(SUB161(auVar13 >> 0x57,0) & 1) << 10 |
             (ushort)(SUB161(auVar13 >> 0x5f,0) & 1) << 0xb |
             (ushort)(SUB161(auVar13 >> 0x67,0) & 1) << 0xc |
             (ushort)(SUB161(auVar13 >> 0x6f,0) & 1) << 0xd |
             (ushort)(SUB161(auVar13 >> 0x77,0) & 1) << 0xe | (ushort)(auVar13[0xf] >> 7) << 0xf;
        auVar3._8_8_ = 0, auVar3._0_8_ = uVar10, x != 0; x = x - 1 & x) {
      local_58 = cVar16;
      cStack_57 = cVar18;
      cStack_56 = cVar19;
      cStack_55 = cVar20;
      cStack_54 = cVar21;
      cStack_53 = cVar22;
      cStack_52 = cVar23;
      cStack_51 = cVar24;
      cStack_50 = cVar25;
      cStack_4f = cVar26;
      cStack_4e = cVar27;
      cStack_4d = cVar28;
      cStack_4c = cVar29;
      cStack_4b = cVar30;
      cStack_4a = cVar31;
      cStack_49 = cVar32;
      uVar5 = TrailingZeros<unsigned_short>(x);
      psVar8 = raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>,_absl::lts_20240722::hash_internal::Hash<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>,_std::equal_to<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>,_std::allocator<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>_>
               ::slot_array((raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>,_absl::lts_20240722::hash_internal::Hash<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>,_std::equal_to<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>,_std::allocator<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>_>
                             *)this);
      uVar11 = uVar5 + local_70.offset_ & local_70.mask_;
      uVar10 = uVar11 * 0x10;
      psVar2 = psVar8 + uVar11;
      auVar15._0_4_ = -(uint)(*(int *)&key->first == *(int *)&psVar2->first);
      auVar15._4_4_ = -(uint)(*(int *)((long)&key->first + 4) == *(int *)((long)&psVar2->first + 4))
      ;
      auVar15._8_4_ = -(uint)(*(int *)&key->second == *(int *)&psVar2->second);
      auVar15._12_4_ =
           -(uint)(*(int *)((long)&key->second + 4) == *(int *)((long)&psVar2->second + 4));
      auVar14._4_4_ = auVar15._0_4_;
      auVar14._0_4_ = auVar15._4_4_;
      auVar14._8_4_ = auVar15._12_4_;
      auVar14._12_4_ = auVar15._8_4_;
      iVar6 = movmskpd((int)psVar8,auVar14 & auVar15);
      if (iVar6 == 3) {
        iVar33 = raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>,_absl::lts_20240722::hash_internal::Hash<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>,_std::equal_to<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>,_std::allocator<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>_>
                 ::iterator_at((raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>,_absl::lts_20240722::hash_internal::Hash<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>,_std::equal_to<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>,_std::allocator<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>_>
                                *)this,uVar11);
        return iVar33;
      }
      cVar16 = local_58;
      cVar18 = cStack_57;
      cVar19 = cStack_56;
      cVar20 = cStack_55;
      cVar21 = cStack_54;
      cVar22 = cStack_53;
      cVar23 = cStack_52;
      cVar24 = cStack_51;
      cVar25 = cStack_50;
      cVar26 = cStack_4f;
      cVar27 = cStack_4e;
      cVar28 = cStack_4d;
      cVar29 = cStack_4c;
      cVar30 = cStack_4b;
      cVar31 = cStack_4a;
      cVar32 = cStack_49;
    }
    auVar17[0] = -(cVar16 == kEmpty);
    auVar17[1] = -(cVar18 == kEmpty);
    auVar17[2] = -(cVar19 == kEmpty);
    auVar17[3] = -(cVar20 == kEmpty);
    auVar17[4] = -(cVar21 == kEmpty);
    auVar17[5] = -(cVar22 == kEmpty);
    auVar17[6] = -(cVar23 == kEmpty);
    auVar17[7] = -(cVar24 == kEmpty);
    auVar17[8] = -(cVar25 == kEmpty);
    auVar17[9] = -(cVar26 == kEmpty);
    auVar17[10] = -(cVar27 == kEmpty);
    auVar17[0xb] = -(cVar28 == kEmpty);
    auVar17[0xc] = -(cVar29 == kEmpty);
    auVar17[0xd] = -(cVar30 == kEmpty);
    auVar17[0xe] = -(cVar31 == kEmpty);
    auVar17[0xf] = -(cVar32 == kEmpty);
    if ((((((((((((((((auVar17 >> 7 & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                     (auVar17 >> 0xf & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    (auVar17 >> 0x17 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                   (auVar17 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  (auVar17 >> 0x27 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                 (auVar17 >> 0x2f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                (auVar17 >> 0x37 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
               (auVar17 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              (auVar17 >> 0x47 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
             (auVar17 >> 0x4f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
            (auVar17 >> 0x57 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
           (auVar17 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
          (auVar17 >> 0x67 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
         (auVar17 >> 0x6f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
        (auVar17 >> 0x77 & (undefined1  [16])0x1) != (undefined1  [16])0x0) || cVar32 == kEmpty)
    break;
    uVar11 = local_70.index_ + 0x10;
    local_70.offset_ = local_70.index_ + local_70.offset_ + 0x10 & local_70.mask_;
    local_70.index_ = uVar11;
    sVar9 = raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>,_absl::lts_20240722::hash_internal::Hash<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>,_std::equal_to<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>,_std::allocator<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>_>
            ::capacity((raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>,_absl::lts_20240722::hash_internal::Hash<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>,_std::equal_to<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>,_std::allocator<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>_>
                        *)this);
    uVar10 = extraout_RDX_00;
    if (sVar9 < uVar11) {
      __assert_fail("seq.index() <= capacity() && \"full table!\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O2/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                    ,0xdbd,
                    "iterator absl::container_internal::raw_hash_set<absl::container_internal::FlatHashSetPolicy<std::pair<const google::protobuf::Message *, const google::protobuf::FieldDescriptor *>>, absl::hash_internal::Hash<std::pair<const google::protobuf::Message *, const google::protobuf::FieldDescriptor *>>, std::equal_to<std::pair<const google::protobuf::Message *, const google::protobuf::FieldDescriptor *>>, std::allocator<std::pair<const google::protobuf::Message *, const google::protobuf::FieldDescriptor *>>>::find_non_soo(const key_arg<K> &, size_t) [Policy = absl::container_internal::FlatHashSetPolicy<std::pair<const google::protobuf::Message *, const google::protobuf::FieldDescriptor *>>, Hash = absl::hash_internal::Hash<std::pair<const google::protobuf::Message *, const google::protobuf::FieldDescriptor *>>, Eq = std::equal_to<std::pair<const google::protobuf::Message *, const google::protobuf::FieldDescriptor *>>, Alloc = std::allocator<std::pair<const google::protobuf::Message *, const google::protobuf::FieldDescriptor *>>, K = std::pair<const google::protobuf::Message *, const google::protobuf::FieldDescriptor *>]"
                   );
    }
  }
  return (iterator)(auVar3 << 0x40);
}

Assistant:

iterator find_non_soo(const key_arg<K>& key, size_t hash) {
    assert(!is_soo());
    auto seq = probe(common(), hash);
    const ctrl_t* ctrl = control();
    while (true) {
      Group g{ctrl + seq.offset()};
      for (uint32_t i : g.Match(H2(hash))) {
        if (ABSL_PREDICT_TRUE(PolicyTraits::apply(
                EqualElement<K>{key, eq_ref()},
                PolicyTraits::element(slot_array() + seq.offset(i)))))
          return iterator_at(seq.offset(i));
      }
      if (ABSL_PREDICT_TRUE(g.MaskEmpty())) return end();
      seq.next();
      assert(seq.index() <= capacity() && "full table!");
    }
  }